

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

void __thiscall duckdb::TopNHeap::Combine(TopNHeap *this,TopNHeap *other)

{
  ulong uVar1;
  undefined8 *puVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  pointer pTVar6;
  pointer pTVar7;
  iterator __position;
  idx_t sel_count;
  ulong uVar8;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *this_00;
  ulong uVar9;
  string_t *right;
  SelectionVector *sel;
  ulong local_a8;
  anon_union_16_2_67f50693_for_value local_98;
  idx_t local_88;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *local_78;
  SelectionVector *local_70;
  ulong local_68;
  DataChunk *local_60;
  DataChunk *local_58;
  StringHeap *local_50;
  anon_union_16_2_67f50693_for_value local_48;
  idx_t local_38;
  
  pTVar6 = (other->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
           super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((other->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
      super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar6) {
    this_00 = (vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *)&this->heap;
    local_50 = &this->sort_key_heap;
    local_60 = &this->heap_data;
    sel = &this->matching_sel;
    local_58 = &other->heap_data;
    local_a8 = 0;
    uVar9 = 0;
    local_78 = this_00;
    local_70 = sel;
    do {
      pTVar6 = pTVar6 + uVar9;
      pTVar7 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->heap_size <=
           (ulong)(((long)(this->heap).
                          super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                          super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 3) *
                  -0x5555555555555555)) &&
         (bVar5 = string_t::StringComparisonOperators::GreaterThan
                            (&pTVar7->sort_key,&pTVar6->sort_key), sel_count = local_a8, !bVar5))
      break;
      if ((pTVar6->sort_key).value.pointer.length < 0xd) {
        local_48.pointer = (pTVar6->sort_key).value.pointer;
      }
      else {
        local_48.pointer =
             (anon_struct_16_3_d7536bce_for_pointer)StringHeap::AddBlob(local_50,&pTVar6->sort_key);
      }
      local_38 = (this->heap_data).count + local_a8;
      pTVar7 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
           super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (this->heap_size <=
          (ulong)(((long)__position._M_current - (long)pTVar7 >> 3) * -0x5555555555555555)) {
        if (0x18 < (long)__position._M_current - (long)pTVar7) {
          local_88 = __position._M_current[-1].index;
          local_98._0_8_ = *(undefined8 *)&__position._M_current[-1].sort_key.value;
          local_98.pointer.ptr = __position._M_current[-1].sort_key.value.pointer.ptr;
          pcVar4 = *(char **)((long)&(pTVar7->sort_key).value + 8);
          *(undefined8 *)&__position._M_current[-1].sort_key.value =
               *(undefined8 *)&(pTVar7->sort_key).value;
          __position._M_current[-1].sort_key.value.pointer.ptr = pcVar4;
          __position._M_current[-1].index = pTVar7->index;
          ::std::
          __adjust_heap<__gnu_cxx::__normal_iterator<duckdb::TopNEntry*,std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>>,long,duckdb::TopNEntry,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar7,0,((long)__position._M_current + (-0x18 - (long)pTVar7) >> 3) *
                              -0x5555555555555555);
          __position._M_current =
               (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        __position._M_current = __position._M_current + -1;
        (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
        super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current;
      }
      local_68 = uVar9;
      if (__position._M_current ==
          (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
          super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>::
        _M_realloc_insert<duckdb::TopNEntry_const&>
                  (this_00,__position,(TopNEntry *)&local_48.pointer);
        pTVar7 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        (__position._M_current)->index = local_38;
        *(undefined8 *)&((__position._M_current)->sort_key).value = local_48._0_8_;
        ((__position._M_current)->sort_key).value.pointer.ptr = local_48.pointer.ptr;
        pTVar7 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
        (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
        super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = pTVar7;
      }
      lVar3 = *(long *)this_00;
      local_88 = pTVar7[-1].index;
      local_98._0_8_ = *(undefined8 *)&pTVar7[-1].sort_key.value;
      local_98.pointer.ptr = pTVar7[-1].sort_key.value.pointer.ptr;
      uVar9 = ((long)pTVar7 - lVar3 >> 3) * -0x5555555555555555 - 1;
      if (0x18 < (long)pTVar7 - lVar3) {
        do {
          uVar1 = uVar9 - 1;
          uVar8 = uVar1 >> 1;
          right = (string_t *)(uVar8 * 0x18 + lVar3);
          bVar5 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)&local_98.pointer,right);
          this_00 = local_78;
          sel = local_70;
          if (!bVar5) goto LAB_00bdda93;
          *(undefined8 *)(lVar3 + 0x10 + uVar9 * 0x18) = *(undefined8 *)&right[1].value;
          pcVar4 = (right->value).pointer.ptr;
          puVar2 = (undefined8 *)(lVar3 + uVar9 * 0x18);
          *puVar2 = *(undefined8 *)&right->value;
          puVar2[1] = pcVar4;
          uVar9 = uVar8;
        } while (1 < uVar1);
        uVar9 = 0;
      }
LAB_00bdda93:
      *(idx_t *)(lVar3 + 0x10 + uVar9 * 0x18) = local_88;
      puVar2 = (undefined8 *)(lVar3 + uVar9 * 0x18);
      *puVar2 = local_98._0_8_;
      puVar2[1] = local_98.pointer.ptr;
      sel_count = local_a8 + 1;
      sel->sel_vector[local_a8] = (sel_t)pTVar6->index;
      if (0x7fe < local_a8) {
        DataChunk::Append(local_60,local_58,true,sel,sel_count);
        sel_count = 0;
      }
      uVar9 = local_68 + 1;
      pTVar6 = (other->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a8 = sel_count;
    } while (uVar9 < (ulong)(((long)(other->heap).
                                    super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                    .
                                    super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 3)
                            * -0x5555555555555555));
    if (sel_count != 0) {
      DataChunk::Append(&this->heap_data,&other->heap_data,true,sel,sel_count);
    }
  }
  Reduce(this);
  return;
}

Assistant:

void TopNHeap::Combine(TopNHeap &other) {
	// "other" is sorted at this point
	idx_t match_count = 0;
	// merge the heap of other into this
	for (idx_t i = 0; i < other.heap.size(); i++) {
		// heap is full - check the latest entry
		auto &other_entry = other.heap[i];
		auto &sort_key = other_entry.sort_key;
		if (!EntryShouldBeAdded(sort_key)) {
			break; // We can break out of the loop here since we sorted the heap
		}
		// add this entry
		TopNEntry new_entry;
		new_entry.sort_key = sort_key.IsInlined() ? sort_key : sort_key_heap.AddBlob(sort_key);
		new_entry.index = heap_data.size() + match_count;
		AddEntryToHeap(new_entry);

		matching_sel.set_index(match_count++, other_entry.index);
		if (match_count >= STANDARD_VECTOR_SIZE) {
			// flush
			heap_data.Append(other.heap_data, true, &matching_sel, match_count);
			match_count = 0;
		}
	}
	if (match_count > 0) {
		// flush
		heap_data.Append(other.heap_data, true, &matching_sel, match_count);
		match_count = 0;
	}
	Reduce();
}